

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecificStrategy.cpp
# Opt level: O0

void __thiscall SpecificStrategy::matchEdges(SpecificStrategy *this,Edge *aEdges,Edge *bEdges)

{
  bool bVar1;
  reference pEVar2;
  _Self local_c8;
  iterator aED_1;
  iterator aIT_1;
  iterator bED_1;
  iterator bIT_1;
  _Self local_40;
  iterator aED;
  iterator aIT;
  iterator bED;
  iterator bIT;
  Edge *bEdges_local;
  Edge *aEdges_local;
  SpecificStrategy *this_local;
  
  bED = std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::begin
                  ((set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_> *)
                   bEdges);
  aIT = std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::end
                  ((set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_> *)
                   bEdges);
  while( true ) {
    bVar1 = std::operator!=(&bED,&aIT);
    if (!bVar1) break;
    pEVar2 = std::_Rb_tree_const_iterator<CfgData::Edge>::operator*(&bED);
    aED = std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::find
                    ((set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_> *
                     )aEdges,pEVar2);
    local_40._M_node =
         (_Base_ptr)
         std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::end
                   ((set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_> *)
                    aEdges);
    bVar1 = std::operator!=(&aED,&local_40);
    if (bVar1) {
      bED = std::set<CfgData::Edge,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>::
            erase_abi_cxx11_((set<CfgData::Edge,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>
                              *)bEdges,bED._M_node);
    }
    else {
      pEVar2 = std::_Rb_tree_const_iterator<CfgData::Edge>::operator*(&bED);
      aED = std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::find
                      (&(aEdges->external).perfect,pEVar2);
      local_40._M_node =
           (_Base_ptr)
           std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::end
                     (&(aEdges->external).perfect);
      bVar1 = std::operator!=(&aED,&local_40);
      if (bVar1) {
        pEVar2 = std::_Rb_tree_const_iterator<CfgData::Edge>::operator*(&aED);
        std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::insert
                  (&(aEdges->external).conflict,pEVar2);
        std::set<CfgData::Edge,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>::
        erase_abi_cxx11_((set<CfgData::Edge,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>
                          *)&aEdges->external,(const_iterator)aED._M_node);
        pEVar2 = std::_Rb_tree_const_iterator<CfgData::Edge>::operator*(&bED);
        std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::insert
                  (&(bEdges->internal).conflict,pEVar2);
        bED = std::set<CfgData::Edge,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>::
              erase_abi_cxx11_((set<CfgData::Edge,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>
                                *)bEdges,bED._M_node);
      }
      else {
        std::_Rb_tree_const_iterator<CfgData::Edge>::operator++(&bED,0);
      }
    }
  }
  bED_1 = std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::begin
                    (&(bEdges->external).perfect);
  aIT_1 = std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::end
                    (&(bEdges->external).perfect);
  while( true ) {
    bVar1 = std::operator!=(&bED_1,&aIT_1);
    if (!bVar1) break;
    pEVar2 = std::_Rb_tree_const_iterator<CfgData::Edge>::operator*(&bED_1);
    aED_1 = std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::find
                      (&(aEdges->external).perfect,pEVar2);
    local_c8._M_node =
         (_Base_ptr)
         std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::end
                   (&(aEdges->external).perfect);
    bVar1 = std::operator!=(&aED_1,&local_c8);
    if (bVar1) {
      bED_1 = std::set<CfgData::Edge,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>::
              erase_abi_cxx11_((set<CfgData::Edge,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>
                                *)&bEdges->external,bED_1._M_node);
    }
    else {
      pEVar2 = std::_Rb_tree_const_iterator<CfgData::Edge>::operator*(&bED_1);
      aED_1 = std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::
              find((set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_> *)
                   aEdges,pEVar2);
      local_c8._M_node =
           (_Base_ptr)
           std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::end
                     ((set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>
                       *)aEdges);
      bVar1 = std::operator!=(&aED_1,&local_c8);
      if (bVar1) {
        pEVar2 = std::_Rb_tree_const_iterator<CfgData::Edge>::operator*(&aED_1);
        std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::insert
                  (&(aEdges->internal).conflict,pEVar2);
        std::set<CfgData::Edge,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>::
        erase_abi_cxx11_((set<CfgData::Edge,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>
                          *)aEdges,(const_iterator)aED_1._M_node);
        pEVar2 = std::_Rb_tree_const_iterator<CfgData::Edge>::operator*(&bED_1);
        std::set<CfgData::Edge,_std::less<CfgData::Edge>,_std::allocator<CfgData::Edge>_>::insert
                  (&(bEdges->external).conflict,pEVar2);
        bED_1 = std::set<CfgData::Edge,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>::
                erase_abi_cxx11_((set<CfgData::Edge,std::less<CfgData::Edge>,std::allocator<CfgData::Edge>>
                                  *)&bEdges->external,bED_1._M_node);
      }
      else {
        std::_Rb_tree_const_iterator<CfgData::Edge>::operator++(&bED_1,0);
      }
    }
  }
  return;
}

Assistant:

void SpecificStrategy::matchEdges(SpecificStrategy::Info::Edge& aEdges,
		SpecificStrategy::Info::Edge& bEdges) {
	for (std::set<CfgData::Edge>::iterator bIT = bEdges.internal.perfect.begin(),
			bED = bEdges.internal.perfect.end(); bIT != bED; ) {
		std::set<CfgData::Edge>::iterator aIT = aEdges.internal.perfect.find(*bIT),
				aED = aEdges.internal.perfect.end();
		if (aIT != aED) {
			bIT = bEdges.internal.perfect.erase(bIT);
			continue;
		}

		aIT = aEdges.external.perfect.find(*bIT),
				aED = aEdges.external.perfect.end();
		if (aIT != aED) {
			aEdges.external.conflict.insert(*aIT);
			aEdges.external.perfect.erase(aIT);

			bEdges.internal.conflict.insert(*bIT);
			bIT = bEdges.internal.perfect.erase(bIT);
			continue;
		}

		bIT++;
	}

	for (std::set<CfgData::Edge>::iterator bIT = bEdges.external.perfect.begin(),
			bED = bEdges.external.perfect.end(); bIT != bED; ) {
		std::set<CfgData::Edge>::iterator aIT = aEdges.external.perfect.find(*bIT),
				aED = aEdges.external.perfect.end();
		if (aIT != aED) {
			bIT = bEdges.external.perfect.erase(bIT);
			continue;
		}

		aIT = aEdges.internal.perfect.find(*bIT),
				aED = aEdges.internal.perfect.end();
		if (aIT != aED) {
			aEdges.internal.conflict.insert(*aIT);
			aEdges.internal.perfect.erase(aIT);

			bEdges.external.conflict.insert(*bIT);
			bIT = bEdges.external.perfect.erase(bIT);
			continue;
		}

		bIT++;
	}
}